

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON__UINT32 __thiscall ON_Mesh::DataCRC(ON_Mesh *this,ON__UINT32 current_remainder)

{
  int iVar1;
  ON__UINT32 OVar2;
  ON_3fPoint *p_00;
  ON_MeshFace *p_01;
  ON_3fVector *p_02;
  ON_3fVector *v;
  ON_3fPoint *p;
  ON__UINT32 current_remainder_local;
  ON_Mesh *this_local;
  
  p_00 = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  iVar1 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  OVar2 = ON_CRC32(current_remainder,(long)iVar1 * 0xc,p_00);
  iVar1 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F);
  p_01 = ON_SimpleArray<ON_MeshFace>::Array(&this->m_F);
  OVar2 = ON_CRC32(OVar2,(long)iVar1 << 4,p_01);
  p_02 = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
  iVar1 = ON_SimpleArray<ON_3fVector>::Count(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
  OVar2 = ON_CRC32(OVar2,(long)iVar1 * 0xc,p_02);
  return OVar2;
}

Assistant:

ON__UINT32 ON_Mesh::DataCRC(ON__UINT32 current_remainder) const
{
  const ON_3fPoint* p = m_V.Array();
  current_remainder = ON_CRC32(current_remainder,m_V.Count()*sizeof(p[0]),p);
  current_remainder = ON_CRC32(current_remainder,m_F.Count()*sizeof(ON_MeshFace),m_F.Array());
  const ON_3fVector* v = m_N.Array();
  current_remainder = ON_CRC32(current_remainder,m_N.Count()*sizeof(v[0]),v);
  return current_remainder;
}